

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

bool __thiscall duckdb::CSVErrorHandler::CanGetLine(CSVErrorHandler *this,idx_t boundary_index)

{
  iterator iVar1;
  ulong uVar2;
  ulong local_28;
  
  uVar2 = 0;
  while (uVar2 < boundary_index) {
    local_28 = uVar2;
    iVar1 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_std::allocator<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->lines_per_batch_map)._M_h,&local_28);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::LinesPerBoundary>,_false>.
        _M_cur == (__node_type *)0x0) break;
    uVar2 = local_28 + 1;
  }
  return boundary_index <= uVar2;
}

Assistant:

bool CSVErrorHandler::CanGetLine(idx_t boundary_index) {
	for (idx_t i = 0; i < boundary_index; i++) {
		if (lines_per_batch_map.find(i) == lines_per_batch_map.end()) {
			return false;
		}
	}
	return true;
}